

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_getAtts(ENCODING *enc,char *ptr,int attsMax,ATTRIBUTE *atts)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  undefined1 uVar6;
  byte *pbVar7;
  char cVar8;
  int iVar9;
  
  iVar3 = 0;
  cVar8 = '\0';
  iVar9 = 1;
switchD_0055cbde_caseD_4:
  iVar5 = iVar9;
  pbVar7 = (byte *)ptr;
  pbVar1 = pbVar7 + 2;
  bVar2 = pbVar7[3];
  if (bVar2 == 0) {
    uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar1);
  }
  else {
    uVar6 = 7;
    if (3 < bVar2 - 0xd8) {
      if (bVar2 - 0xdc < 4) {
        uVar6 = 8;
      }
      else if ((bVar2 == 0xff) && (0xfd < *pbVar1)) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0x1d;
      }
    }
  }
  ptr = (char *)pbVar1;
  iVar9 = iVar5;
  switch(uVar6) {
  case 3:
    if (iVar3 < attsMax) {
      atts[iVar3].normalized = '\0';
    }
  default:
    goto switchD_0055cbde_caseD_4;
  case 5:
  case 0x16:
  case 0x18:
  case 0x1d:
    if ((iVar5 == 0) && (iVar9 = 1, iVar3 < attsMax)) {
      atts[iVar3].name = (char *)pbVar1;
      atts[iVar3].normalized = '\x01';
    }
    goto switchD_0055cbde_caseD_4;
  case 6:
    ptr = (char *)(pbVar7 + 3);
    if ((iVar5 == 0) && (iVar9 = 1, iVar3 < attsMax)) {
      atts[iVar3].name = (char *)pbVar1;
      atts[iVar3].normalized = '\x01';
    }
    goto switchD_0055cbde_caseD_4;
  case 7:
    if ((iVar5 == 0) && (iVar5 = 1, iVar3 < attsMax)) {
      atts[iVar3].name = (char *)pbVar1;
      atts[iVar3].normalized = '\x01';
    }
    ptr = (char *)(pbVar7 + 4);
    iVar9 = iVar5;
    goto switchD_0055cbde_caseD_4;
  case 9:
  case 10:
    iVar9 = 0;
    if (((iVar5 != 1) && (iVar9 = iVar5, iVar5 == 2)) && (iVar9 = 2, iVar3 < attsMax)) {
      atts[iVar3].normalized = '\0';
    }
    goto switchD_0055cbde_caseD_4;
  case 0xb:
  case 0x11:
    goto switchD_0055cbde_caseD_b;
  case 0xc:
    if (iVar5 != 2) {
      cVar8 = '\f';
LAB_0055ce40:
      iVar9 = 2;
      if (iVar3 < attsMax) {
        atts[iVar3].valuePtr = (char *)(pbVar7 + 4);
      }
      goto switchD_0055cbde_caseD_4;
    }
    iVar9 = 2;
    if (cVar8 != '\f') goto switchD_0055cbde_caseD_4;
    if (iVar3 < attsMax) {
      atts[iVar3].valueEnd = (char *)pbVar1;
    }
    cVar8 = '\f';
    break;
  case 0xd:
    if (iVar5 != 2) {
      cVar8 = '\r';
      goto LAB_0055ce40;
    }
    iVar9 = 2;
    if (cVar8 != '\r') goto switchD_0055cbde_caseD_4;
    if (iVar3 < attsMax) {
      atts[iVar3].valueEnd = (char *)pbVar1;
    }
    cVar8 = '\r';
    break;
  case 0x15:
    iVar9 = 0;
    if ((((iVar5 != 1) && (iVar9 = iVar5, iVar5 == 2)) && (iVar9 = 2, iVar3 < attsMax)) &&
       (atts[iVar3].normalized != '\0')) {
      if (((bVar2 == 0) && (pbVar1 != (byte *)atts[iVar3].valuePtr)) && (*pbVar1 == 0x20)) {
        bVar2 = pbVar7[5];
        if (bVar2 == 0) {
          if (pbVar7[4] == 0x20) goto LAB_0055cea6;
          cVar4 = *(char *)((long)enc[1].scanners + (ulong)pbVar7[4]);
        }
        else {
          cVar4 = '\a';
          if (3 < bVar2 - 0xd8) {
            if (bVar2 - 0xdc < 4) {
              cVar4 = '\b';
            }
            else if ((bVar2 != 0xff) || (cVar4 = '\0', pbVar7[4] < 0xfe)) {
              cVar4 = '\x1d';
            }
          }
        }
        if (cVar4 != cVar8) goto switchD_0055cbde_caseD_4;
      }
LAB_0055cea6:
      atts[iVar3].normalized = '\0';
    }
    goto switchD_0055cbde_caseD_4;
  }
  iVar3 = iVar3 + 1;
  iVar9 = 0;
  goto switchD_0055cbde_caseD_4;
switchD_0055cbde_caseD_b:
  iVar9 = 2;
  if (iVar5 != 2) {
    return iVar3;
  }
  goto switchD_0055cbde_caseD_4;
}

Assistant:

static int PTRCALL
PREFIX(getAtts)(const ENCODING *enc, const char *ptr,
                int attsMax, ATTRIBUTE *atts)
{
  enum { other, inName, inValue } state = inName;
  int nAtts = 0;
  int open = 0; /* defined when state == inValue;
                   initialization just to shut up compilers */

  for (ptr += MINBPC(enc);; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define START_NAME \
      if (state == other) { \
        if (nAtts < attsMax) { \
          atts[nAtts].name = ptr; \
          atts[nAtts].normalized = 1; \
        } \
        state = inName; \
      }
#define LEAD_CASE(n) \
    case BT_LEAD ## n: START_NAME ptr += (n - MINBPC(enc)); break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
    case BT_HEX:
      START_NAME
      break;
#undef START_NAME
    case BT_QUOT:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_QUOT;
      }
      else if (open == BT_QUOT) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_APOS:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_APOS;
      }
      else if (open == BT_APOS) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_AMP:
      if (nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_S:
      if (state == inName)
        state = other;
      else if (state == inValue
               && nAtts < attsMax
               && atts[nAtts].normalized
               && (ptr == atts[nAtts].valuePtr
                   || BYTE_TO_ASCII(enc, ptr) != ASCII_SPACE
                   || BYTE_TO_ASCII(enc, ptr + MINBPC(enc)) == ASCII_SPACE
                   || BYTE_TYPE(enc, ptr + MINBPC(enc)) == open))
        atts[nAtts].normalized = 0;
      break;
    case BT_CR: case BT_LF:
      /* This case ensures that the first attribute name is counted
         Apart from that we could just change state on the quote. */
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_GT:
    case BT_SOL:
      if (state != inValue)
        return nAtts;
      break;
    default:
      break;
    }
  }
  /* not reached */
}